

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O3

void cos1D_predict<IMLE>(IMLE *imleObj)

{
  double *pdVar1;
  value_type *__x;
  pointer pdVar2;
  pointer pdVar3;
  double *pdVar4;
  X *pXVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined8 *puVar8;
  Index index;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int k;
  int iVar12;
  uint uVar13;
  result_type_conflict rVar14;
  double dVar15;
  uniform_01<double,_double> uniform;
  Vec x;
  Vec z;
  vector<double,_std::allocator<double>_> invSol;
  mt19937 rng;
  new_uniform_01<double> local_a49;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a48;
  Z local_a38;
  double local_a20;
  vector<double,_std::allocator<double>_> local_a18;
  ulong local_a00;
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  local_9f8;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&local_9f8,
         &boost::random::
          mersenne_twister_engine<unsigned_int,32ul,624ul,397ul,31ul,2567483615u,11ul,4294967295u,7ul,2636928640u,15ul,4022730752u,18ul,1812433253u>
          ::default_seed);
  local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  pdVar4 = (double *)malloc(8);
  if (pdVar4 == (double *)0x0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = operator_delete;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
  local_a48.m_storage.m_data = (double *)0x0;
  local_a48.m_storage.m_rows = 0;
  local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar4
  ;
  pdVar4 = (double *)malloc(8);
  if (pdVar4 != (double *)0x0) {
    local_a48.m_storage.m_rows = 1;
    local_a48.m_storage.m_data = pdVar4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t --- Forward Prediction (random input locations): ---",0x36)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    iVar12 = 0;
    do {
      rVar14 = boost::random::detail::new_uniform_01<double>::operator()(&local_a49,&local_9f8);
      *local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           rVar14 * 4.0 * 3.141592653589793;
      pXVar5 = IMLE::predict(imleObj,&local_a38);
      pdVar4 = (pXVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      uVar7 = (pXVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows;
      if (local_a48.m_storage.m_rows != uVar7) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a48,uVar7,1);
        uVar7 = local_a48.m_storage.m_rows;
      }
      uVar9 = uVar7 - ((long)uVar7 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar7) {
        lVar10 = 0;
        do {
          pdVar1 = pdVar4 + lVar10;
          dVar15 = pdVar1[1];
          local_a48.m_storage.m_data[lVar10] = *pdVar1;
          (local_a48.m_storage.m_data + lVar10)[1] = dVar15;
          lVar10 = lVar10 + 2;
        } while (lVar10 < (long)uVar9);
      }
      if ((long)uVar9 < (long)uVar7) {
        do {
          local_a48.m_storage.m_data[uVar9] = pdVar4[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t cos(",6);
      poVar6 = std::ostream::_M_insert<double>
                         (*local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
      dVar15 = cos(*local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data);
      poVar6 = std::ostream::_M_insert<double>(dVar15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tpred(",6);
      poVar6 = std::ostream::_M_insert<double>
                         (*local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
      poVar6 = std::ostream::_M_insert<double>(*local_a48.m_storage.m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  (error = ",0xb);
      dVar15 = cos(*local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data);
      poVar6 = std::ostream::_M_insert<double>(dVar15 - *local_a48.m_storage.m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t\t    Jacobian(",0xf);
      poVar6 = std::ostream::_M_insert<double>
                         (*local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
      dVar15 = sin(*local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data);
      poVar6 = std::ostream::_M_insert<double>(-dVar15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\t\tpredJacobian(",0xf);
      poVar6 = std::ostream::_M_insert<double>
                         (*local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ",4);
      IMLE::getMultiplePredictionsJacobian(imleObj);
      poVar6 = std::ostream::_M_insert<double>
                         (*(imleObj->predictionsJacobian).
                           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[imleObj->solIdx].
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_data);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      iVar12 = iVar12 + 1;
    } while (iVar12 != 10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\t --- Inverse Prediction (random output locations): ---",0x37
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    uVar13 = 0;
    do {
      local_a00 = (ulong)uVar13;
      rVar14 = boost::random::detail::new_uniform_01<double>::operator()(&local_a49,&local_9f8);
      dVar15 = rVar14 + rVar14 + -1.0;
      *local_a48.m_storage.m_data = dVar15;
      local_a20 = acos(dVar15);
      IMLE::predictInverse(imleObj,(X *)&local_a48);
      local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      iVar12 = imleObj->nInvSolFound;
      lVar10 = (long)iVar12;
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          __x = *(value_type **)
                 ((long)&(((imleObj->invPredictions).
                           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data + lVar11);
          if (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                      (&local_a18,
                       (iterator)
                       local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,__x);
          }
          else {
            *local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = *__x;
            local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          pdVar3 = local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar2 = local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x10;
        } while (lVar10 << 4 != lVar11);
        if (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar7 = (long)local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3;
          lVar11 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar11 == 0; lVar11 = lVar11 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pdVar2,pdVar3);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tinvCos(",8);
      poVar6 = std::ostream::_M_insert<double>(*local_a48.m_storage.m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ( ",6);
      poVar6 = std::ostream::_M_insert<double>(local_a20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::ostream::_M_insert<double>(6.283185307179586 - local_a20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::ostream::_M_insert<double>(local_a20 + 6.283185307179586);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
      poVar6 = std::ostream::_M_insert<double>(12.566370614359172 - local_a20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," )",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t  pred(",8);
      poVar6 = std::ostream::_M_insert<double>(*local_a48.m_storage.m_data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") = ( ",6);
      if (0 < iVar12) {
        lVar11 = 0;
        do {
          poVar6 = std::ostream::_M_insert<double>
                             (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar11]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      uVar7 = local_a00;
      if (local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_a18.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar13 = (int)uVar7 + 1;
    } while (uVar13 != 10);
    free(local_a48.m_storage.m_data);
    free(local_a38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar8 = operator_delete;
  __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void cos1D_predict( Learner &imleObj)
{
    // Random number generation
    boost::mt19937 rng;
    boost::uniform_01<Scal> uniform;
    // Query dataset size
    const int NPOINTS_QUERY = 10;
    // Input and output Eigen vectors
    Vec z(1), x(1);

    // Forward Prediction
    cout << "\t --- Forward Prediction (random input locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        z[0] = uniform(rng) * 4*M_PI;

        x = imleObj.predict(z);
        // Alternatively:
        //      imleObj.predict();
        //      x = getPrediction()[0];

        cout << "\t cos(" << z[0] << ") = " << cos(z[0]) << endl;
        cout << "\tpred(" << z[0] << ") = " << x[0] << "  (error = " << cos(z[0])-x[0] << ")" << endl;
        cout << "\t\t    Jacobian(" << z[0] << ") = " << -sin(z[0]) << endl;
        cout << "\t\tpredJacobian(" << z[0] << ") = " << imleObj.getPredictionJacobian()(0,0) << endl;
    }

    // Inverse Prediction
    cout << "\t --- Inverse Prediction (random output locations): ---" << endl;
    for(int k = 0; k < NPOINTS_QUERY; k++)
    {
        x[0] = uniform(rng) * 2.0 - 1.0;
        Scal inv_x = acos(x[0]);

        imleObj.predictInverse(x);

        vector<Scal> invSol;
        int nSol = imleObj.getNumberOfInverseSolutionsFound();
        for( int k = 0; k < nSol; k++ )
            invSol.push_back( imleObj.getInversePredictions()[k][0] );
        sort(invSol.begin(), invSol.end() );

        cout << "\tinvCos(" << x[0] << ") = ( " << inv_x << ", " << 2.0*M_PI-inv_x << ", " << 2.0*M_PI+inv_x << ", " << 4.0*M_PI-inv_x << " )" << endl;
        cout << "\t  pred(" << x[0] << ") = ( ";
        for( int k = 0; k < nSol; k++ )
            cout << invSol[k] << ", ";
        cout << ")" << endl;
    }
}